

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPo.c
# Opt level: O2

void Vec_IntPushOrderAbs(Vec_Int_t *p,int Entry)

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  int nCapMin;
  uint uVar7;
  uint uVar8;
  
  uVar1 = p->nSize;
  uVar6 = 0;
  uVar4 = 0;
  if (0 < (int)uVar1) {
    uVar6 = (ulong)uVar1;
  }
  while (uVar6 != uVar4) {
    piVar3 = p->pArray + uVar4;
    uVar4 = uVar4 + 1;
    if (*piVar3 == Entry) {
      __assert_fail("Entry != p->pArray[i]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecPo.c"
                    ,0xd4,"void Vec_IntPushOrderAbs(Vec_Int_t *, int)");
    }
  }
  if (uVar1 == p->nCap) {
    nCapMin = 0x10;
    if (0xf < (int)uVar1) {
      nCapMin = uVar1 * 2;
    }
    Vec_IntGrow(p,nCapMin);
  }
  uVar1 = p->nSize;
  uVar4 = (ulong)uVar1;
  p->nSize = uVar1 + 1;
  uVar7 = -Entry;
  if (0 < Entry) {
    uVar7 = Entry;
  }
  piVar3 = p->pArray;
  for (; uVar5 = (int)uVar1 >> 0x1f & uVar1, 0 < (int)(uint)uVar4; uVar4 = uVar4 - 1) {
    uVar2 = piVar3[uVar4 - 1];
    uVar8 = -uVar2;
    if (0 < (int)uVar2) {
      uVar8 = uVar2;
    }
    uVar5 = (uint)uVar4;
    if (uVar7 <= uVar8) break;
    piVar3[uVar4] = uVar2;
  }
  piVar3[(int)uVar5] = Entry;
  return;
}

Assistant:

static inline void Vec_IntPushOrderAbs( Vec_Int_t * p, int Entry )
{
    int i;
    for ( i = 0; i < p->nSize; i++ )
        assert( Entry != p->pArray[i] );
    if ( p->nSize == p->nCap )
    {
        if ( p->nCap < 16 )
            Vec_IntGrow( p, 16 );
        else
            Vec_IntGrow( p, 2 * p->nCap );
    }
    p->nSize++;
    for ( i = p->nSize-2; i >= 0; i-- )
        if ( Abc_AbsInt(p->pArray[i]) < Abc_AbsInt(Entry) )
            p->pArray[i+1] = p->pArray[i];
        else
            break;
    p->pArray[i+1] = Entry;
}